

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void setCursorImage(_GLFWwindow *window,_GLFWcursorWayland *cursorWayland)

{
  wl_cursor_image *pwVar1;
  wl_surface *surface_00;
  int local_5c;
  int scale;
  wl_surface *surface;
  wl_buffer *buffer;
  wl_cursor_image *image;
  wl_cursor *wlCursor;
  itimerspec timer;
  _GLFWcursorWayland *cursorWayland_local;
  _GLFWwindow *window_local;
  
  timer.it_value.tv_nsec = (__syscall_slong_t)cursorWayland;
  memset(&wlCursor,0,0x20);
  surface_00 = _glfw.wl.cursorSurface;
  image = *(wl_cursor_image **)timer.it_value.tv_nsec;
  local_5c = 1;
  if (image == (wl_cursor_image *)0x0) {
    surface = *(wl_surface **)(timer.it_value.tv_nsec + 0x10);
  }
  else {
    if ((1 < (window->wl).bufferScale) && (*(long *)(timer.it_value.tv_nsec + 8) != 0)) {
      image = *(wl_cursor_image **)(timer.it_value.tv_nsec + 8);
      local_5c = 2;
    }
    pwVar1 = *(wl_cursor_image **)
              (*(long *)&image->hotspot_x + (long)*(int *)(timer.it_value.tv_nsec + 0x28) * 8);
    surface = (wl_surface *)(*_glfw.wl.cursor.image_get_buffer)(pwVar1);
    if (surface == (wl_surface *)0x0) {
      return;
    }
    timer.it_interval.tv_nsec = (ulong)pwVar1->delay / 1000;
    timer.it_value.tv_sec = (__time_t)((pwVar1->delay % 1000) * 1000000);
    timerfd_settime(_glfw.wl.cursorTimerfd,0,(itimerspec *)&wlCursor,(itimerspec *)0x0);
    *(uint32_t *)(timer.it_value.tv_nsec + 0x18) = pwVar1->width;
    *(uint32_t *)(timer.it_value.tv_nsec + 0x1c) = pwVar1->height;
    *(uint32_t *)(timer.it_value.tv_nsec + 0x20) = pwVar1->hotspot_x;
    *(uint32_t *)(timer.it_value.tv_nsec + 0x24) = pwVar1->hotspot_y;
  }
  wl_pointer_set_cursor
            (_glfw.wl.pointer,_glfw.wl.pointerEnterSerial,surface_00,
             *(int *)(timer.it_value.tv_nsec + 0x20) / local_5c,
             *(int *)(timer.it_value.tv_nsec + 0x24) / local_5c);
  wl_surface_set_buffer_scale(surface_00,local_5c);
  wl_surface_attach(surface_00,(wl_buffer *)surface,0,0);
  wl_surface_damage(surface_00,0,0,*(int32_t *)(timer.it_value.tv_nsec + 0x18),
                    *(int32_t *)(timer.it_value.tv_nsec + 0x1c));
  wl_surface_commit(surface_00);
  return;
}

Assistant:

static void setCursorImage(_GLFWwindow* window,
                           _GLFWcursorWayland* cursorWayland)
{
    struct itimerspec timer = {0};
    struct wl_cursor* wlCursor = cursorWayland->cursor;
    struct wl_cursor_image* image;
    struct wl_buffer* buffer;
    struct wl_surface* surface = _glfw.wl.cursorSurface;
    int scale = 1;

    if (!wlCursor)
        buffer = cursorWayland->buffer;
    else
    {
        if (window->wl.bufferScale > 1 && cursorWayland->cursorHiDPI)
        {
            wlCursor = cursorWayland->cursorHiDPI;
            scale = 2;
        }

        image = wlCursor->images[cursorWayland->currentImage];
        buffer = wl_cursor_image_get_buffer(image);
        if (!buffer)
            return;

        timer.it_value.tv_sec = image->delay / 1000;
        timer.it_value.tv_nsec = (image->delay % 1000) * 1000000;
        timerfd_settime(_glfw.wl.cursorTimerfd, 0, &timer, NULL);

        cursorWayland->width = image->width;
        cursorWayland->height = image->height;
        cursorWayland->xhot = image->hotspot_x;
        cursorWayland->yhot = image->hotspot_y;
    }

    wl_pointer_set_cursor(_glfw.wl.pointer, _glfw.wl.pointerEnterSerial,
                          surface,
                          cursorWayland->xhot / scale,
                          cursorWayland->yhot / scale);
    wl_surface_set_buffer_scale(surface, scale);
    wl_surface_attach(surface, buffer, 0, 0);
    wl_surface_damage(surface, 0, 0,
                      cursorWayland->width, cursorWayland->height);
    wl_surface_commit(surface);
}